

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O0

void printDefines(FILE *out,TA_FuncInfo *funcInfo)

{
  TA_IntegerList *pTVar1;
  long *plVar2;
  char *pcVar3;
  double *in_RSI;
  FILE *in_RDI;
  TA_RealList *realList;
  TA_IntegerList *intList;
  char *defaultParamName;
  char *paramName;
  uint paramNb;
  uint j;
  uint i;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_RetCode retCode;
  FILE *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *local_40;
  char *local_38;
  uint local_28;
  uint local_24;
  TA_OptInputParameterInfo *local_20;
  TA_RetCode local_14;
  double *local_10;
  FILE *local_8;
  
  if (in_RDI != (FILE *)0x0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_24 = 0; local_24 < *(uint *)(local_10 + 5); local_24 = local_24 + 1) {
      local_14 = TA_GetOptInputParameterInfo((TA_FuncHandle *)local_10[6],local_24,&local_20);
      if (local_14 != TA_SUCCESS) {
        printf("[%s] invalid \'optional input\' information\n",*local_10);
        return;
      }
      local_38 = local_20->paramName;
      if (local_20->type == TA_OptInput_RealList) {
        local_40 = "optInReal";
LAB_001158d1:
        if (local_38 == (char *)0x0) {
          local_38 = local_40;
        }
        if (local_20->type == TA_OptInput_RealList) {
          fprintf(local_8,"\n/* TA_%s: Optional Parameter %s */\n",*local_10,local_38);
          plVar2 = (long *)local_20->dataSet;
          for (local_28 = 0; local_28 < *(uint *)(plVar2 + 1); local_28 = local_28 + 1) {
            strcpy(gTempBuf,*(char **)(*plVar2 + (ulong)local_28 * 0x10 + 8));
            cnvtChar(gTempBuf,' ','_');
            trimWhitespace((char *)in_stack_ffffffffffffff98);
            cnvtToUpperCase(in_stack_ffffffffffffffa0);
            in_stack_ffffffffffffffa0 = (char *)*local_10;
            in_stack_ffffffffffffff98 = local_8;
            pcVar3 = doubleToStr((double)in_stack_ffffffffffffffa0);
            fprintf(in_stack_ffffffffffffff98,"#define TA_%s_%s %s\n",in_stack_ffffffffffffffa0,
                    gTempBuf,pcVar3);
          }
          fprintf(local_8,"\n");
        }
        else if ((local_20->type == TA_OptInput_IntegerList) &&
                (pTVar1 = (TA_IntegerList *)local_20->dataSet, pTVar1 != &TA_MA_TypeList)) {
          fprintf(local_8,"\n/* TA_%s: Optional Parameter %s */\n",*local_10,local_38);
          for (local_28 = 0; local_28 < pTVar1->nbElement; local_28 = local_28 + 1) {
            strcpy(gTempBuf,pTVar1->data[local_28].string);
            cnvtChar(gTempBuf,' ','_');
            trimWhitespace((char *)in_stack_ffffffffffffff98);
            cnvtToUpperCase(in_stack_ffffffffffffffa0);
            fprintf(local_8,"#define TA_%s_%s %d\n",*local_10,gTempBuf,
                    (ulong)(uint)pTVar1->data[local_28].value);
          }
          fprintf(local_8,"\n");
        }
      }
      else if (local_20->type == TA_OptInput_IntegerList) {
        local_40 = "optInInteger";
        goto LAB_001158d1;
      }
    }
  }
  return;
}

Assistant:

static void printDefines( FILE *out, const TA_FuncInfo *funcInfo )
{
   TA_RetCode retCode;
   const TA_OptInputParameterInfo *optInputParamInfo;
   unsigned int i, j;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   TA_IntegerList *intList;
   TA_RealList    *realList;

   if (!out) return;

   /* Go through the optional parameter and print
    * the corresponding define for the TA_OptInput_IntegerList
    * and TA_OptInput_RealList having a string.
    */
   paramNb = 0;
   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                             i, &optInputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
         return;
      }

      paramName = optInputParamInfo->paramName;

      /* TA_MA: Value for parameter */

      switch( optInputParamInfo->type )
      {
      case TA_OptInput_RealList:
         defaultParamName = "optInReal";
         break;
      case TA_OptInput_IntegerList:
         defaultParamName = "optInInteger";
         break;
      default:
         paramNb++;
         continue; /* Skip other type of parameter */
      }

      if( !paramName )
         paramName = defaultParamName;

      /* Output a comment to guide the user. */
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_IntegerList:
            intList = (TA_IntegerList *)optInputParamInfo->dataSet;
            if( intList != (TA_IntegerList *)TA_DEF_UI_MA_Method.dataSet )
            {
               fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                        funcInfo->name, paramName );
               for( j=0; j < intList->nbElement; j++ )
               {
                  strcpy( gTempBuf, intList->data[j].string );
                  cnvtChar( gTempBuf, ' ', '_' );
                  trimWhitespace( gTempBuf );
                  cnvtToUpperCase( gTempBuf );
                  fprintf( out, "#define TA_%s_%s %d\n",
                           funcInfo->name,
                           gTempBuf,
                           intList->data[j].value );

               }
               fprintf( out, "\n" );
            }
            break;
         case TA_OptInput_RealList:
            fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                     funcInfo->name, paramName );

            realList = (TA_RealList *)optInputParamInfo->dataSet;
            for( j=0; j < realList->nbElement; j++ )
            {
               strcpy( gTempBuf, realList->data[j].string );
               cnvtChar( gTempBuf, ' ', '_' );
               trimWhitespace( gTempBuf );
               cnvtToUpperCase( gTempBuf );
               fprintf( out, "#define TA_%s_%s %s\n",
                        funcInfo->name,
                        gTempBuf,
                        doubleToStr(realList->data[j].value) );

            }
            fprintf( out, "\n" );
            break;
         default:
            /* Do nothing */
            break;
         }

      paramNb++;
   }
}